

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::IngestRanges(DBImpl *this,string *oldfname,string *newfname)

{
  _func_int **pp_Var1;
  Table *pTVar2;
  Comparator *pCVar3;
  int iVar4;
  Iterator *pIVar5;
  Iterator *pIVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  RandomAccessFile *pRVar7;
  Iterator *pIVar8;
  RandomAccessFile *oldfile;
  Table *newtable;
  RandomAccessFile *newfile;
  Table *oldtable;
  WriteBatch batch;
  uint64_t newfile_size;
  uint64_t oldfile_size;
  ReadOptions readoptions;
  Options options;
  Slice local_118;
  Slice local_108;
  RandomAccessFile *local_f8;
  Table *local_f0;
  RandomAccessFile *local_e8;
  Table *local_e0;
  WriteBatch local_d8;
  string *local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  ReadOptions local_a0;
  Options local_90;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  Options::Options(&local_90);
  local_90.filter_policy = (FilterPolicy *)0x0;
  local_90.compression = kSnappyCompression;
  local_a0.verify_checksums = false;
  local_a0.fill_cache = true;
  local_a0.snapshot = (Snapshot *)0x0;
  local_f8 = (RandomAccessFile *)0x0;
  local_e0 = (Table *)0x0;
  (**(code **)(*(long *)oldfname->_M_string_length + 0x58))
            (&local_d8,(long *)oldfname->_M_string_length,newfname,&local_a8);
  (this->super_DB)._vptr_DB = (_func_int **)local_d8.rep_._M_dataplus._M_p;
  if ((_func_int **)local_d8.rep_._M_dataplus._M_p == (_func_int **)0x0) {
    (**(code **)(*(long *)oldfname->_M_string_length + 0x18))
              (&local_d8,(long *)oldfname->_M_string_length,newfname,&local_f8);
    (this->super_DB)._vptr_DB = (_func_int **)local_d8.rep_._M_dataplus._M_p;
  }
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    Table::Open((Table *)&local_d8,&local_90,local_f8,local_a8,&local_e0);
    (this->super_DB)._vptr_DB = (_func_int **)local_d8.rep_._M_dataplus._M_p;
  }
  pTVar2 = local_e0;
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    pIVar5 = Table::NewIterator(local_e0,&local_a0);
    local_e8 = (RandomAccessFile *)0x0;
    local_f0 = (Table *)0x0;
    (**(code **)(*(long *)oldfname->_M_string_length + 0x58))(&local_d8);
    (this->super_DB)._vptr_DB = (_func_int **)local_d8.rep_._M_dataplus._M_p;
    if ((_func_int **)local_d8.rep_._M_dataplus._M_p == (_func_int **)0x0) {
      (**(code **)(*(long *)oldfname->_M_string_length + 0x18))(&local_d8);
      (this->super_DB)._vptr_DB = (_func_int **)local_d8.rep_._M_dataplus._M_p;
    }
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      Table::Open((Table *)&local_d8,&local_90,local_e8,local_b0,&local_f0);
      (this->super_DB)._vptr_DB = (_func_int **)local_d8.rep_._M_dataplus._M_p;
    }
    pTVar2 = local_e0;
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      pIVar6 = Table::NewIterator(local_f0,&local_a0);
      WriteBatch::WriteBatch(&local_d8);
      local_b8 = oldfname;
      (*pIVar5->_vptr_Iterator[3])(pIVar5);
      (*pIVar6->_vptr_Iterator[3])(pIVar6);
LAB_0010d335:
      do {
        iVar4 = (*pIVar5->_vptr_Iterator[2])(pIVar5);
        if ((char)iVar4 == '\0') {
          iVar4 = (*pIVar6->_vptr_Iterator[2])(pIVar6);
          if ((char)iVar4 == '\0') {
            local_108.data_ = (char *)((ulong)local_108.data_ & 0xffffffffffffff00);
            (**(code **)((local_b8->_M_dataplus)._M_p + 0x20))
                      (&local_118,local_b8,&local_108,&local_d8);
            pp_Var1 = (this->super_DB)._vptr_DB;
            (this->super_DB)._vptr_DB = (_func_int **)local_118.data_;
            local_118.data_ = (char *)pp_Var1;
            if (pp_Var1 != (_func_int **)0x0) {
              operator_delete__(pp_Var1);
            }
            (*pIVar5->_vptr_Iterator[1])(pIVar5);
            pTVar2 = local_e0;
            if (local_e0 != (Table *)0x0) {
              Table::~Table(local_e0);
              operator_delete(pTVar2);
            }
            if (local_f8 != (RandomAccessFile *)0x0) {
              (*local_f8->_vptr_RandomAccessFile[1])();
            }
            (*pIVar6->_vptr_Iterator[1])(pIVar6);
            pTVar2 = local_f0;
            if (local_f0 != (Table *)0x0) {
              Table::~Table(local_f0);
              operator_delete(pTVar2);
            }
            if (local_e8 != (RandomAccessFile *)0x0) {
              (*local_e8->_vptr_RandomAccessFile[1])();
            }
            WriteBatch::~WriteBatch(&local_d8);
            return (Status)(char *)this;
          }
          iVar4 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
          local_118.data_ = (char *)CONCAT44(extraout_var_03,iVar4);
          iVar4 = (*pIVar6->_vptr_Iterator[9])(pIVar6);
          local_108.data_ = (char *)CONCAT44(extraout_var_04,iVar4);
          WriteBatch::Put(&local_d8,&local_118,&local_108);
          pIVar8 = pIVar6;
        }
        else {
          iVar4 = (*pIVar6->_vptr_Iterator[2])(pIVar6);
          pCVar3 = local_90.comparator;
          if ((char)iVar4 != '\0') {
            iVar4 = (*pIVar5->_vptr_Iterator[8])(pIVar5);
            local_118.data_ = (char *)CONCAT44(extraout_var,iVar4);
            iVar4 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
            local_108.data_ = (char *)CONCAT44(extraout_var_00,iVar4);
            iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_118,&local_108);
            pCVar3 = local_90.comparator;
            if (iVar4 < 0) {
              iVar4 = (*pIVar5->_vptr_Iterator[8])(pIVar5);
              local_118.data_ = (char *)CONCAT44(extraout_var_06,iVar4);
              WriteBatch::Delete(&local_d8,&local_118);
              pIVar8 = pIVar5;
            }
            else {
              pIVar8 = pIVar6;
              if (iVar4 == 0) {
                iVar4 = (*pIVar5->_vptr_Iterator[9])(pIVar5);
                local_118.data_ = (char *)CONCAT44(extraout_var_07,iVar4);
                iVar4 = (*pIVar6->_vptr_Iterator[9])(pIVar6);
                local_108.data_ = (char *)CONCAT44(extraout_var_08,iVar4);
                iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_118,&local_108);
                if (iVar4 != 0) {
                  iVar4 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
                  local_118.data_ = (char *)CONCAT44(extraout_var_09,iVar4);
                  iVar4 = (*pIVar6->_vptr_Iterator[9])(pIVar6);
                  local_108.data_ = (char *)CONCAT44(extraout_var_10,iVar4);
                  WriteBatch::Put(&local_d8,&local_118,&local_108);
                }
                (*pIVar5->_vptr_Iterator[6])(pIVar5);
              }
              else {
                iVar4 = (*pIVar6->_vptr_Iterator[8])(pIVar6);
                local_118.data_ = (char *)CONCAT44(extraout_var_01,iVar4);
                iVar4 = (*pIVar6->_vptr_Iterator[9])(pIVar6);
                local_108.data_ = (char *)CONCAT44(extraout_var_02,iVar4);
                WriteBatch::Put(&local_d8,&local_118,&local_108);
              }
            }
            (*pIVar8->_vptr_Iterator[6])();
            goto LAB_0010d335;
          }
          iVar4 = (*pIVar5->_vptr_Iterator[8])(pIVar5);
          local_118.data_ = (char *)CONCAT44(extraout_var_05,iVar4);
          WriteBatch::Delete(&local_d8,&local_118);
          pIVar8 = pIVar5;
        }
        (*pIVar8->_vptr_Iterator[6])();
      } while( true );
    }
    if (local_e0 != (Table *)0x0) {
      Table::~Table(local_e0);
      operator_delete(pTVar2);
    }
    if (local_f8 != (RandomAccessFile *)0x0) {
      (*local_f8->_vptr_RandomAccessFile[1])();
    }
    pTVar2 = local_f0;
    pRVar7 = local_e8;
    if (local_f0 != (Table *)0x0) {
      Table::~Table(local_f0);
      operator_delete(pTVar2);
      pRVar7 = local_e8;
    }
  }
  else {
    pRVar7 = local_f8;
    if (local_e0 != (Table *)0x0) {
      Table::~Table(local_e0);
      operator_delete(pTVar2);
      pRVar7 = local_f8;
    }
  }
  if (pRVar7 != (RandomAccessFile *)0x0) {
    (*pRVar7->_vptr_RandomAccessFile[1])();
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::IngestRanges(const std::string& oldfname, 
                            const std::string& newfname) {
  Status s;
  Options options;
  options.filter_policy = nullptr;
  options.compression = kSnappyCompression;
  ReadOptions readoptions;
  readoptions.fill_cache = true;

  // get iterator for old file
  uint64_t oldfile_size;
  RandomAccessFile* oldfile = nullptr;
  Table* oldtable = nullptr;

  s = env_->GetFileSize(oldfname, &oldfile_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(oldfname, &oldfile);
  }

  if (s.ok()) {
    s = Table::Open(options, oldfile, oldfile_size, &oldtable);
  }

  if (!s.ok()) {
    delete oldtable;
    delete oldfile;
    return s;
  }

  Iterator* olditer = oldtable->NewIterator(readoptions);

  // get iterator for new file
  uint64_t newfile_size;
  RandomAccessFile* newfile = nullptr;
  Table* newtable = nullptr;

  s = env_->GetFileSize(newfname, &newfile_size);
  if (s.ok()) {
    s = env_->NewRandomAccessFile(newfname, &newfile);
  }

  if (s.ok()) {
    s = Table::Open(options, newfile, newfile_size, &newtable);
  }

  if (!s.ok()) {
    delete oldtable;
    delete oldfile;
    delete newtable;
    delete newfile;
    return s;
  }

  Iterator* newiter = newtable->NewIterator(readoptions);

  // Merge two iter and update db
  WriteBatch batch;

  olditer->SeekToFirst();
  newiter->SeekToFirst();
  while (true)
  {
    if(!olditer->Valid()) {
      if(newiter->Valid()) {
        batch.Put(newiter->key(), newiter->value());
        newiter->Next();
      }
      else break;
    }
    else if(!newiter->Valid()){
      batch.Delete(olditer->key());
      olditer->Next();
    }
    else {
      int cmp = options.comparator->Compare(olditer->key(), newiter->key());
      if (cmp < 0) {
        batch.Delete(olditer->key());
        olditer->Next();
      }
      else if (cmp == 0) {
        if (options.comparator->Compare(olditer->value(), newiter->value()) != 0) {
          batch.Put(newiter->key(), newiter->value());
        }
        olditer->Next();
        newiter->Next();
      }
      else {
        batch.Put(newiter->key(), newiter->value());
        newiter->Next();
      }
    }
  }

  s = Write(WriteOptions(), &batch);
  
  delete olditer;
  delete oldtable;
  delete oldfile;
  delete newiter;
  delete newtable;
  delete newfile;

  return s;
}